

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

long getarg(int x,int y,STATE s)

{
  int iVar1;
  
  iVar1 = -arg[x][y];
  if (AI_COLOR == s) {
    iVar1 = arg[x][y];
  }
  return (long)iVar1;
}

Assistant:

long getarg(int x, int y, STATE s) {
    return (s == AI_COLOR ? arg[x][y] : -arg[x][y]);
/*#ifdef AI_COLOR_BLACK
	return (s == BLACK ? arg[x][y] : -arg[x][y]);
#endif
#ifdef AI_COLOR_WHITE
	return (s == WHITE ? arg[x][y] : -arg[x][y]);
#endif*/
}